

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::buildRenderPass
          (BasicGraphicsTestInstance *this,VkFormat colorFormat,VkFormat depthFormat)

{
  VkRenderPass obj;
  Handle<(vk::HandleType)17> HVar1;
  VkAllocationCallbacks *pVVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDescription subpassDescription;
  Move<vk::Handle<(vk::HandleType)17>_> local_128;
  VkAttachmentReference local_108;
  VkAttachmentReference local_100;
  VkRenderPassCreateInfo local_f8;
  undefined1 local_b8 [40];
  VkFormat local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined4 local_74;
  VkSubpassDescription local_68;
  
  pDVar3 = Context::getDeviceInterface
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  pVVar4 = Context::getDevice((this->super_TimestampTestInstance).super_TestInstance.m_context);
  local_f8.pAttachments = (VkAttachmentDescription *)local_b8;
  local_b8._0_4_ = 0;
  local_b8._8_8_ = 0x100000001;
  local_b8._16_8_ = 0x200000000;
  local_b8._24_8_ = 0x200000001;
  local_b8._32_8_ = 2;
  local_8c = 0x100000001;
  uStack_84 = 0x200000001;
  local_7c = 0x300000001;
  local_74 = 3;
  local_68.pColorAttachments = &local_100;
  local_100.attachment = 0;
  local_100.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_68.pDepthStencilAttachment = &local_108;
  local_108.attachment = 1;
  local_108.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  local_f8.pSubpasses = &local_68;
  local_68.flags = 0;
  local_68.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_68.inputAttachmentCount = 0;
  local_68.pInputAttachments = (VkAttachmentReference *)0x0;
  local_68.colorAttachmentCount = 1;
  local_68.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_68.preserveAttachmentCount = 0;
  local_68.pPreserveAttachments = (deUint32 *)0x0;
  local_f8.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_f8.pNext = (void *)0x0;
  local_f8.flags = 0;
  local_f8.attachmentCount = 2;
  local_f8.subpassCount = 1;
  local_f8.dependencyCount = 0;
  local_f8.pDependencies = (VkSubpassDependency *)0x0;
  local_b8._4_4_ = colorFormat;
  local_90 = depthFormat;
  ::vk::createRenderPass(&local_128,pDVar3,pVVar4,&local_f8,(VkAllocationCallbacks *)0x0);
  pVVar2 = local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  pVVar4 = local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  pDVar3 = local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  HVar1.m_internal =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         pVVar4;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         pVVar2;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         HVar1.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj);
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         pVVar4;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         pVVar2;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         HVar1.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = pDVar3;
    if (local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                 (VkRenderPass)
                 local_128.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
    }
  }
  return;
}

Assistant:

void BasicGraphicsTestInstance::buildRenderPass(VkFormat colorFormat, VkFormat depthFormat)
{
	const DeviceInterface&      vk       = m_context.getDeviceInterface();
	const VkDevice              vkDevice = m_context.getDevice();

	// Create render pass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags    flags;
			colorFormat,                                        // VkFormat                        format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits           samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp              loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,                       // VkAttachmentStoreOp             storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp              stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp             stencilStoreOp;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   finalLayout;
		};

		const VkAttachmentDescription depthAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags flags;
			depthFormat,                                        // VkFormat                     format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits        samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp           loadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp           stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          stencilStoreOp;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                initialLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                finalLayout;
		};

		const VkAttachmentDescription attachments[2] =
		{
			colorAttachmentDescription,
			depthAttachmentDescription
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL            // VkImageLayout    layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			1u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL    // VkImageLayout    layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			0u,                                                 // VkSubpassDescriptionFlags        flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,                    // VkPipelineBindPoint              pipelineBindPoint;
			0u,                                                 // deUint32                         inputAttachmentCount;
			DE_NULL,                                            // const VkAttachmentReference*     pInputAttachments;
			1u,                                                 // deUint32                         colorAttachmentCount;
			&colorAttachmentReference,                          // const VkAttachmentReference*     pColorAttachments;
			DE_NULL,                                            // const VkAttachmentReference*     pResolveAttachments;
			&depthAttachmentReference,                          // const VkAttachmentReference*     pDepthStencilAttachment;
			0u,                                                 // deUint32                         preserveAttachmentCount;
			DE_NULL                                             // const VkAttachmentReference*     pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassParams =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,          // VkStructureType                  sType;
			DE_NULL,                                            // const void*                      pNext;
			0u,                                                 // VkRenderPassCreateFlags          flags;
			2u,                                                 // deUint32                         attachmentCount;
			attachments,                                        // const VkAttachmentDescription*   pAttachments;
			1u,                                                 // deUint32                         subpassCount;
			&subpassDescription,                                // const VkSubpassDescription*      pSubpasses;
			0u,                                                 // deUint32                         dependencyCount;
			DE_NULL                                             // const VkSubpassDependency*       pDependencies;
		};

		m_renderPass = createRenderPass(vk, vkDevice, &renderPassParams);
	}

}